

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O0

void __thiscall RotatingLog_OneFile_Test::~RotatingLog_OneFile_Test(RotatingLog_OneFile_Test *this)

{
  RotatingLog_OneFile_Test *this_local;
  
  ~RotatingLog_OneFile_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (RotatingLog, OneFile) {
    using ::testing::_;
    using ::testing::Expectation;
    using ::testing::Invoke;
    using ::testing::StrEq;

    using log_type = pstore::basic_rotating_log<mock_string_stream_traits, mock_file_system_traits>;
    log_type log ("base_name", std::streamoff{0} /*max_bytes*/, 0U /*num_backups*/);

    Expectation open =
        EXPECT_CALL (log.stream_traits (), open (_, StrEq ("base_name"), _)).Times (1);
    EXPECT_CALL (log.stream_traits (), close (_)).Times (1).After (open);

    EXPECT_CALL (log.file_system_traits (), exists (_)).Times (0);
    EXPECT_CALL (log.file_system_traits (), unlink (_)).Times (0);
    EXPECT_CALL (log.file_system_traits (), rename (_, _)).Times (0);

    // Finally, we can log a simple string.
    log.log_impl ("hello world");

    EXPECT_TRUE (log.is_open ())
        << "Expected the log file to open after a message has been written";
    EXPECT_EQ ("hello world", log.stream ().str ());
}